

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O0

bool __thiscall ConfigReader::parseArea(ConfigReader *this)

{
  double dVar1;
  double dVar2;
  invalid_argument *ia;
  double hd;
  double wd;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  undefined4 local_b8;
  allocator<char> local_b1;
  string local_b0;
  token_t local_7c;
  undefined1 local_78 [4];
  token_t tok;
  string h;
  string w;
  string tokstr;
  ConfigReader *this_local;
  
  std::__cxx11::string::string((string *)(w.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(h.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_78);
  local_7c = tokenize(this,(string *)(h.field_2._M_local_buf + 8));
  if (local_7c == TOK_NUMBER) {
    local_7c = tokenize(this,(string *)local_78);
    if (local_7c == TOK_NUMBER) {
      local_7c = tokenize(this,(string *)((long)&w.field_2 + 8));
      if (local_7c == TOK_SEMICOL) {
        dVar1 = std::__cxx11::stod((string *)((long)&h.field_2 + 8),(size_t *)0x0);
        dVar2 = std::__cxx11::stod((string *)local_78,(size_t *)0x0);
        (*this->_vptr_ConfigReader[4])(dVar1,dVar2);
        this_local._7_1_ = true;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"Expected ;\n",(allocator<char> *)((long)&wd + 7));
        error(this,&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator((allocator<char> *)((long)&wd + 7));
        this_local._7_1_ = false;
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,"Expected a number for area height\n",&local_d9);
      error(this,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
      this_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Expected a number for area width\n",&local_b1);
    error(this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    this_local._7_1_ = false;
  }
  local_b8 = 1;
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)(h.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(w.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool ConfigReader::parseArea()
{
    // AREA: x y 
    std::string tokstr;
    std::string w,h;

    // width
    ConfigReader::token_t tok = tokenize(w);
    if (tok != TOK_NUMBER)
    {
        error("Expected a number for area width\n");
        return false;
    }

    // height
    tok = tokenize(h);
    if (tok != TOK_NUMBER)
    {
        error("Expected a number for area height\n");
        return false;
    }

    // expect semicol
    tok = tokenize(tokstr);
    if (tok != TOK_SEMICOL)
    {
        error("Expected ;\n");
        return false;
    }

    double wd, hd;
    try
    {
        wd = std::stod(w);
        hd = std::stod(h);
    }
    catch(const std::invalid_argument& ia)
    {
        error(ia.what());
        return false;
    }

    onArea(wd,hd);
    return true;
}